

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestP4.cxx
# Opt level: O2

void __thiscall cmCTestP4::UserParser::UserParser(UserParser *this,cmCTestP4 *p4,char *prefix)

{
  cmProcessTools::LineParser::LineParser(&this->super_LineParser,'\n',true);
  (this->super_LineParser).super_OutputParser._vptr_OutputParser =
       (_func_int **)&PTR__UserParser_00a0bb68;
  (this->RegexUser).regmust = (char *)0x0;
  (this->RegexUser).program = (char *)0x0;
  (this->RegexUser).progsize = 0;
  memset(&this->RegexUser,0,0x20a);
  this->P4 = p4;
  cmProcessTools::LineParser::SetLog
            (&this->super_LineParser,(p4->super_cmCTestGlobalVC).super_cmCTestVC.Log,prefix);
  cmsys::RegularExpression::compile(&this->RegexUser,"^(.+) <(.*)> \\((.*)\\) accessed (.*)$");
  return;
}

Assistant:

UserParser(cmCTestP4* p4, const char* prefix)
    : P4(p4)
  {
    this->SetLog(&this->P4->Log, prefix);
    this->RegexUser.compile("^(.+) <(.*)> \\((.*)\\) accessed (.*)$");
  }